

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O3

double __thiscall MeshDenoisingBase::getAverageEdgeLength(MeshDenoisingBase *this,TriMesh *mesh)

{
  double dVar1;
  mesh_ptr pPVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  EdgeIter EVar8;
  EdgeIter EVar9;
  Normal local_70;
  double local_58;
  double local_50;
  double local_48;
  undefined1 local_40 [8];
  EdgeIter e_it;
  
  EVar8 = OpenMesh::PolyConnectivity::edges_begin((PolyConnectivity *)mesh);
  uVar4 = EVar8._8_8_;
  _local_40 = EVar8;
  EVar9 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
  e_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
  e_it.skip_bits_ = 0;
  if (EVar8.hnd_.super_BaseHandle.idx_.super_BaseHandle !=
      (BaseHandle)EVar9.hnd_.super_BaseHandle.idx_ || EVar8.mesh_ != EVar9.mesh_) {
    e_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
    e_it.skip_bits_ = 0;
    do {
      OpenMesh::
      PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      ::calc_edge_vector(&local_70,
                         (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          *)mesh,(HalfedgeHandle)((int)uVar4 * 2));
      pPVar2 = e_it.mesh_;
      e_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)local_40._8_4_.super_BaseHandle + 1);
      dVar6 = local_70.super_VectorDataT<double,_3>.values_[2];
      dVar7 = local_70.super_VectorDataT<double,_3>.values_[1];
      dVar1 = local_70.super_VectorDataT<double,_3>.values_[0];
      if ((ulong)pPVar2 >> 0x20 != 0) {
        local_58 = local_70.super_VectorDataT<double,_3>.values_[0];
        local_50 = local_70.super_VectorDataT<double,_3>.values_[2];
        local_48 = local_70.super_VectorDataT<double,_3>.values_[1];
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                    *)local_40);
        dVar6 = local_50;
        dVar7 = local_48;
        dVar1 = local_58;
      }
      e_it._8_8_ = (double)e_it._8_8_ + SQRT(dVar6 * dVar6 + dVar1 * dVar1 + dVar7 * dVar7);
      EVar8 = OpenMesh::PolyConnectivity::edges_end((PolyConnectivity *)mesh);
      uVar4 = (ulong)(uint)e_it.mesh_._0_4_;
    } while (e_it.mesh_._0_4_ != (BaseHandle)EVar8.hnd_.super_BaseHandle.idx_ ||
             local_40 != (undefined1  [8])EVar8.mesh_);
  }
  uVar3 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x20))(mesh);
  auVar5._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar5._0_8_ = uVar3;
  auVar5._12_4_ = 0x45300000;
  return (double)e_it._8_8_ /
         ((auVar5._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
}

Assistant:

double MeshDenoisingBase::getAverageEdgeLength(TriMesh &mesh)
{
    double average_edge_length = 0.0;
    for(TriMesh::EdgeIter e_it = mesh.edges_begin(); e_it != mesh.edges_end(); e_it++)
        average_edge_length += mesh.calc_edge_length(*e_it);
    double edgeNum = (double)mesh.n_edges();
    average_edge_length /= edgeNum;

    return average_edge_length;
}